

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

void proto2_unittest::TestAllExtensionsLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  
  if (from_msg == to_msg) {
    MergeImpl();
  }
  google::protobuf::internal::ExtensionSet::MergeFrom
            ((ExtensionSet *)(to_msg + 1),(MessageLite *)_TestAllExtensionsLite_default_instance_,
             (ExtensionSet *)(from_msg + 1));
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
            (&to_msg->_internal_metadata_,(string *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestAllExtensionsLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestAllExtensionsLite*>(&to_msg);
  auto& from = static_cast<const TestAllExtensionsLite&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestAllExtensionsLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}